

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O1

UConverter * ucnv_openU_63(UChar *name,UErrorCode *err)

{
  int32_t iVar1;
  char *converterName;
  UConverter *pUVar2;
  char asciiName [60];
  char acStack_58 [72];
  
  if ((err != (UErrorCode *)0x0) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (name == (UChar *)0x0) {
      pUVar2 = ucnv_createConverter_63((UConverter *)0x0,(char *)0x0,err);
      return pUVar2;
    }
    iVar1 = u_strlen_63(name);
    if (iVar1 < 0x3c) {
      converterName = u_austrcpy_63(acStack_58,name);
      if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
        pUVar2 = ucnv_createConverter_63((UConverter *)0x0,converterName,err);
        return pUVar2;
      }
    }
    else {
      *err = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return (UConverter *)0x0;
}

Assistant:

U_CAPI UConverter*   U_EXPORT2
ucnv_openU (const UChar * name,
                         UErrorCode * err)
{
    char asciiName[UCNV_MAX_CONVERTER_NAME_LENGTH];

    if (err == NULL || U_FAILURE(*err))
        return NULL;
    if (name == NULL)
        return ucnv_open (NULL, err);
    if (u_strlen(name) >= UCNV_MAX_CONVERTER_NAME_LENGTH)
    {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    return ucnv_open(u_austrcpy(asciiName, name), err);
}